

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adios2_c_io.cpp
# Opt level: O0

adios2_error adios2_get_parameter(char *value,size_t *size,adios2_io *io,char *key)

{
  bool bVar1;
  char *in_RCX;
  undefined8 *in_RSI;
  const_iterator itParameter;
  IO *ioCpp;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffeb8;
  string *in_stack_fffffffffffffec0;
  _Self local_c8;
  allocator local_b9;
  string local_b8 [32];
  _Self local_98;
  allocator local_89;
  string *in_stack_ffffffffffffff78;
  adios2_io *in_stack_ffffffffffffff80;
  allocator local_49;
  string local_48 [32];
  char *local_28;
  undefined8 *local_18;
  adios2_error local_4;
  
  local_28 = in_RCX;
  local_18 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_48,"for const adios2_io, in call to adios2_get_parameter",&local_49);
  adios2::helper::CheckForNullptr<adios2_io_const>
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xffffffffffffff78,"for size_t* size, in call to adios2_get_parameter",
             &local_89);
  adios2::helper::CheckForNullptr<unsigned_long>
            ((unsigned_long *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff78);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b8,local_28,&local_b9);
  local_98._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(in_stack_fffffffffffffeb8,(key_type *)0x1414a2);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  local_c8._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(in_stack_fffffffffffffeb8);
  bVar1 = std::operator==(&local_98,&local_c8);
  if (bVar1) {
    *local_18 = 0;
    local_4 = adios2_error_none;
  }
  else {
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x14160b);
    local_4 = anon_unknown.dwarf_edb6::String2CAPI
                        (in_stack_fffffffffffffec0,(char *)in_stack_fffffffffffffeb8,
                         (size_t *)0x141627);
  }
  return local_4;
}

Assistant:

adios2_error adios2_get_parameter(char *value, size_t *size, const adios2_io *io, const char *key)
{
    try
    {
        adios2::helper::CheckForNullptr(io, "for const adios2_io, in call to adios2_get_parameter");

        const adios2::core::IO *ioCpp = reinterpret_cast<const adios2::core::IO *>(io);

        adios2::helper::CheckForNullptr(size, "for size_t* size, in call to adios2_get_parameter");

        auto itParameter = ioCpp->m_Parameters.find(key);
        if (itParameter == ioCpp->m_Parameters.end())
        {
            *size = 0;
            return adios2_error_none;
        }

        return String2CAPI(itParameter->second, value, size);
    }
    catch (...)
    {
        return static_cast<adios2_error>(adios2::helper::ExceptionToError("adios2_get_parameter"));
    }
}